

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

ostream * __thiscall nivalis::Function::to_bin(Function *this,ostream *os)

{
  long lVar1;
  size_type sVar2;
  ostream *in_RSI;
  long in_RDI;
  size_t i_1;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  ostream *in_stack_ffffffffffffff80;
  ostream *poVar3;
  ostream *this_00;
  undefined8 local_20;
  undefined4 local_14;
  
  poVar3 = in_RSI;
  std::__cxx11::string::size();
  util::write_bin<unsigned_long>
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  this_00 = in_RSI;
  lVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)this_00,lVar1);
  util::write_bin<int>(in_stack_ffffffffffffff80,(int)in_stack_ffffffffffffff7c);
  std::__cxx11::string::size();
  util::write_bin<unsigned_long>
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  lVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)in_RSI,lVar1);
  Expr::to_bin((Expr *)this_00,poVar3);
  Expr::to_bin((Expr *)this_00,poVar3);
  Expr::to_bin((Expr *)this_00,poVar3);
  Expr::to_bin((Expr *)this_00,poVar3);
  Expr::to_bin((Expr *)this_00,poVar3);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    util::write_bin<float>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  util::write_bin<float>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  util::write_bin<float>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
            ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)(in_RDI + 0x118));
  util::write_bin<unsigned_long>
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                      ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)(in_RDI + 0x118));
    if (sVar2 <= local_20) break;
    std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::operator[]
              ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)(in_RDI + 0x118),local_20);
    Expr::to_bin((Expr *)this_00,poVar3);
    local_20 = local_20 + 1;
  }
  poVar3 = in_RSI;
  std::__cxx11::string::size();
  util::write_bin<unsigned_long>
            (poVar3,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  lVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)in_RSI,lVar1);
  return in_RSI;
}

Assistant:

std::ostream& Function::to_bin(std::ostream& os) const {
    util::write_bin(os, name.size());
    os.write(name.c_str(), name.size());
    util::write_bin(os, type);
    util::write_bin(os, expr_str.size());
    os.write(expr_str.c_str(), expr_str.size());

    expr.to_bin(os); diff.to_bin(os);
    ddiff.to_bin(os); recip.to_bin(os);
    drecip.to_bin(os);
    for (int i = 0; i < 4; ++i) util::write_bin(os, line_color.data[i]);
    util::write_bin(os, tmin);
    util::write_bin(os, tmax);

    util::write_bin(os, exprs.size());
    for (size_t i = 0; i < exprs.size(); ++i) {
        exprs[i].to_bin(os);
    }

    util::write_bin(os, str.size());
    os.write(str.c_str(), str.size());
    return os;
}